

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meiju_1.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  istream *this;
  ostream *this_00;
  int local_1c;
  int local_18;
  int i;
  int cnt;
  int m;
  int n;
  
  m = 0;
  local_18 = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&cnt);
  std::istream::operator>>(this,&i);
  for (local_1c = cnt; local_1c <= i; local_1c = local_1c + 1) {
    bVar1 = judge(local_1c);
    if (!bVar1) {
      local_18 = local_18 + 1;
    }
  }
  this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
    int n,m,cnt = 0;
    cin >> n >> m;
    for (int i = n; i <= m; ++i) {
        if(!judge(i))
        {
            cnt++;
        }
    }
    cout << cnt << endl;
    return 0;
}